

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void save_engravings(memfile *mf,level *lev)

{
  xchar xVar1;
  char *txtbase;
  engr *ep;
  level *lev_local;
  memfile *mf_local;
  
  mfmagic_set(mf,0x52474e45);
  for (txtbase = (char *)lev->lev_engr; txtbase != (char *)0x0; txtbase = *(char **)txtbase) {
    if ((*(int *)(txtbase + 0x10) != 0) && (**(char **)(txtbase + 8) != '\0')) {
      xVar1 = ledger_no(&lev->z);
      mtag(mf,(long)((int)xVar1 + txtbase[0x20] * 0x100 + txtbase[0x21] * 0x10000),MTAG_ENGRAVING);
      mwrite32(mf,*(int32_t *)(txtbase + 0x10));
      mwrite8(mf,txtbase[0x20]);
      mwrite8(mf,txtbase[0x21]);
      mwrite8(mf,txtbase[0x22]);
      mwrite(mf,txtbase + 0x28,*(uint *)(txtbase + 0x10));
    }
  }
  mwrite32(mf,0);
  return;
}

Assistant:

void save_engravings(struct memfile *mf, struct level *lev)
{
	struct engr *ep;
	char *txtbase; /* ep->engr_txt may have been incremented */

	mfmagic_set(mf, ENGRAVE_MAGIC);
	
	for (ep = lev->lev_engr; ep; ep = ep->nxt_engr) {
	    if (ep->engr_lth && ep->engr_txt[0]) {
		/* To distinguish engravings from each other in tags,
		 * we use x/y/z coords. */
		mtag(mf, ledger_no(&lev->z) + ((int)ep->engr_x << 8) +
		     ((int)ep->engr_y << 16), MTAG_ENGRAVING);
		mwrite32(mf, ep->engr_lth);
		mwrite8(mf, ep->engr_x);
		mwrite8(mf, ep->engr_y);
		mwrite8(mf, ep->engr_type);
		txtbase = (char *)(ep + 1);
		mwrite(mf, txtbase, ep->engr_lth);
	    }
	}
	mwrite32(mf, 0); /* no more engravings */
}